

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O0

void __thiscall CBlockHeaderAndShortTxIDs::FillShortTxIDSelector(CBlockHeaderAndShortTxIDs *this)

{
  long lVar1;
  CSHA256 *this_00;
  iterator data;
  uint64_t uVar2;
  uint64_t *in_RDI;
  long in_FS_OFFSET;
  DataStream stream;
  uint256 shorttxidhash;
  CSHA256 hasher;
  CSHA256 *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  DataStream *in_stack_fffffffffffffec8;
  CSHA256 *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffeb8);
  DataStream::operator<<
            (in_stack_fffffffffffffec8,
             (CBlockHeader *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  DataStream::operator<<
            (in_stack_fffffffffffffec8,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  CSHA256::CSHA256(in_stack_fffffffffffffeb8);
  DataStream::begin(in_stack_fffffffffffffec8);
  this_00 = (CSHA256 *)
            __gnu_cxx::
            __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
            ::operator*((__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                         *)in_stack_fffffffffffffeb8);
  DataStream::end((DataStream *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  data = DataStream::begin(in_stack_fffffffffffffec8);
  __gnu_cxx::operator-
            ((__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              *)in_stack_fffffffffffffec8,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  CSHA256::Write(this_00,data._M_current,in_stack_fffffffffffffed8);
  uint256::uint256((uint256 *)in_stack_fffffffffffffeb8);
  base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffeb8);
  CSHA256::Finalize(in_stack_fffffffffffffed0,(uchar *)in_stack_fffffffffffffec8);
  uVar2 = base_blob<256U>::GetUint64
                    ((base_blob<256U> *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  *in_RDI = uVar2;
  uVar2 = base_blob<256U>::GetUint64
                    ((base_blob<256U> *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  in_RDI[1] = uVar2;
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockHeaderAndShortTxIDs::FillShortTxIDSelector() const {
    DataStream stream{};
    stream << header << nonce;
    CSHA256 hasher;
    hasher.Write((unsigned char*)&(*stream.begin()), stream.end() - stream.begin());
    uint256 shorttxidhash;
    hasher.Finalize(shorttxidhash.begin());
    shorttxidk0 = shorttxidhash.GetUint64(0);
    shorttxidk1 = shorttxidhash.GetUint64(1);
}